

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u32 uVar1;
  u8 *puVar2;
  u32 uVar3;
  ushort uVar4;
  ushort uVar5;
  u16 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ushort *puVar11;
  ushort uVar12;
  ulong uVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  u32 uVar20;
  u8 *local_70;
  u8 *local_50;
  
  puVar2 = pPage->aData;
  uVar13 = (ulong)pPage->hdrOffset;
  uVar12 = pPage->cellOffset;
  uVar7 = pPage->nCell;
  uVar17 = (uint)uVar12 + (uint)uVar7 * 2;
  uVar1 = pPage->pBt->usableSize;
  if ((nMaxFrag < (int)(uint)puVar2[uVar13 + 7]) ||
     (uVar4 = *(ushort *)(puVar2 + uVar13 + 1) << 8 | *(ushort *)(puVar2 + uVar13 + 1) >> 8,
     uVar4 == 0)) {
LAB_001399f7:
    uVar20 = uVar1;
    if ((ulong)uVar7 != 0) {
      uVar19 = 0;
      local_50 = (u8 *)0x0;
      local_70 = puVar2;
      uVar3 = uVar1;
      do {
        uVar4 = *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar12) << 8 |
                *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar12) >> 8;
        if ((uVar4 < uVar17) ||
           (uVar10 = (uint)uVar4, uVar10 != uVar1 - 4 && (int)(uVar1 - 4) <= (int)(uint)uVar4)) {
          uVar14 = 0xfb96;
          goto LAB_00139c97;
        }
        uVar6 = (*pPage->xCellSize)(pPage,local_70 + uVar10);
        uVar20 = uVar3 - uVar6;
        if (((int)uVar20 < (int)uVar17) || ((int)uVar1 < (int)((uint)uVar4 + (uint)uVar6))) {
          uVar14 = 0xfb9c;
          goto LAB_00139c97;
        }
        *(ushort *)(puVar2 + uVar19 * 2 + (ulong)uVar12) = (ushort)uVar20 << 8 | (ushort)uVar20 >> 8
        ;
        if (local_50 == (u8 *)0x0) {
          if (uVar20 != uVar10) {
            local_70 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar4 = *(ushort *)(puVar2 + uVar13 + 5) << 8 | *(ushort *)(puVar2 + uVar13 + 5) >> 8;
            memcpy(local_70 + uVar4,puVar2 + uVar4,(long)(int)(uVar3 - uVar4));
            local_50 = local_70;
            goto LAB_00139b0b;
          }
          local_50 = (u8 *)0x0;
        }
        else {
LAB_00139b0b:
          memcpy(puVar2 + uVar20,local_70 + uVar10,(ulong)uVar6);
        }
        uVar19 = uVar19 + 1;
        uVar3 = uVar20;
      } while (uVar7 != uVar19);
    }
    puVar2[uVar13 + 7] = '\0';
  }
  else {
    uVar5 = *(ushort *)(puVar2 + uVar4) << 8 | *(ushort *)(puVar2 + uVar4) >> 8;
    if ((uVar5 != 0) && ((puVar2[uVar5] != '\0' || (puVar2[(ulong)uVar5 + 1] != '\0'))))
    goto LAB_001399f7;
    uVar7 = *(ushort *)(puVar2 + uVar13 + 5) << 8 | *(ushort *)(puVar2 + uVar13 + 5) >> 8;
    iVar18 = (uint)uVar4 - (uint)uVar7;
    if ((uint)uVar4 < (uint)uVar7 || iVar18 == 0) {
      uVar14 = 0xfb74;
      goto LAB_00139c97;
    }
    uVar8 = *(ushort *)(puVar2 + (ulong)uVar4 + 2) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar4 + 2) >> 8;
    uVar10 = (uint)uVar8;
    if (uVar5 == 0) {
      uVar16 = 0;
    }
    else {
      uVar9 = *(ushort *)(puVar2 + (ulong)uVar5 + 2) << 8 |
              *(ushort *)(puVar2 + (ulong)uVar5 + 2) >> 8;
      uVar16 = (uint)uVar9;
      uVar10 = (uint)uVar8 + (uint)uVar4;
      memmove(puVar2 + (uVar10 + uVar9),puVar2 + uVar10,(long)(int)(uVar5 - uVar10));
      uVar10 = (uint)uVar8 + (uint)uVar9;
    }
    uVar20 = uVar10 + uVar7;
    memmove(puVar2 + uVar20,puVar2 + uVar7,(long)iVar18);
    if (uVar12 < uVar17) {
      puVar11 = (ushort *)(puVar2 + uVar12);
      do {
        uVar12 = *puVar11 << 8 | *puVar11 >> 8;
        uVar15 = uVar10;
        if ((uVar12 < uVar4) || (uVar15 = uVar16, uVar12 < uVar5)) {
          uVar12 = uVar12 + (short)uVar15;
          *puVar11 = uVar12 * 0x100 | uVar12 >> 8;
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 < puVar2 + uVar17);
    }
  }
  if ((uint)puVar2[uVar13 + 7] + (uVar20 - uVar17) == (uint)pPage->nFree) {
    *(ushort *)(puVar2 + uVar13 + 5) = (ushort)uVar20 << 8 | (ushort)uVar20 >> 8;
    (puVar2 + uVar13 + 1)[0] = '\0';
    (puVar2 + uVar13 + 1)[1] = '\0';
    memset(puVar2 + uVar17,0,(long)(int)(uVar20 - uVar17));
    return 0;
  }
  uVar14 = 0xfbb0;
LAB_00139c97:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar14,
              "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  return 0xb;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);

      /* pageFindSlot() has already verified that free blocks are sorted
      ** in order of offset within the page, and that no block extends
      ** past the end of the page. Provided the two free slots do not 
      ** overlap, this guarantees that the memmove() calls below will not
      ** overwrite the usableSize byte buffer, even if the database page
      ** is corrupt.  */
      assert( iFree2==0 || iFree2>iFree );
      assert( iFree+get2byte(&data[iFree+2]) <= usableSize );
      assert( iFree2==0 || iFree2+get2byte(&data[iFree2+2]) <= usableSize );

      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          assert( iFree+sz<=iFree2 ); /* Verified by pageFindSlot() */
          sz2 = get2byte(&data[iFree2+2]);
          assert( iFree+sz+sz2+iFree2-(iFree+sz) <= usableSize );
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }
        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}